

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphVertex.h
# Opt level: O2

string * __thiscall
GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
toString(string *__return_storage_ptr__,
        GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"(",&this->name);
  std::operator+(__return_storage_ptr__,&local_30,")");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string GraphVertex<T>::toString()
{
  return ("(" + name + ")");
}